

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O0

S2Point * __thiscall
s2builderutil::IntLatLngSnapFunction::SnapPoint
          (S2Point *__return_storage_ptr__,IntLatLngSnapFunction *this,S2Point *point)

{
  ostream *poVar1;
  double dVar2;
  R2Point local_88;
  S1Angle local_78;
  int64 local_70;
  int64 lng;
  int64 local_60;
  int64 lat;
  S2LatLng input;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2Point *local_18;
  S2Point *point_local;
  IntLatLngSnapFunction *this_local;
  
  local_18 = point;
  point_local = (S2Point *)this;
  if (-1 < this->exponent_) {
    S2LatLng::S2LatLng((S2LatLng *)&lat,point);
    lng = (int64)S2LatLng::lat((S2LatLng *)&lat);
    dVar2 = S1Angle::degrees((S1Angle *)&lng);
    local_60 = MathUtil::FastInt64Round(dVar2 * this->from_degrees_);
    local_78 = S2LatLng::lng((S2LatLng *)&lat);
    dVar2 = S1Angle::degrees(&local_78);
    local_70 = MathUtil::FastInt64Round(dVar2 * this->from_degrees_);
    local_88.c_ = (VType  [2])
                  S2LatLng::FromDegrees
                            ((double)local_60 * this->to_degrees_,
                             (double)local_70 * this->to_degrees_);
    S2LatLng::ToPoint(__return_storage_ptr__,(S2LatLng *)&local_88);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
             ,0x157,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_30);
  poVar1 = std::operator<<(poVar1,"Check failed: (exponent_) >= (0) ");
  S2LogMessageVoidify::operator&(&local_19,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

S2Point IntLatLngSnapFunction::SnapPoint(const S2Point& point) const {
  S2_DCHECK_GE(exponent_, 0);  // Make sure the snap function was initialized.
  S2LatLng input(point);
  int64 lat = MathUtil::FastInt64Round(input.lat().degrees() * from_degrees_);
  int64 lng = MathUtil::FastInt64Round(input.lng().degrees() * from_degrees_);
  return S2LatLng::FromDegrees(lat * to_degrees_, lng * to_degrees_).ToPoint();
}